

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pcmpgtb_mips64(uint64_t fs,uint64_t ft)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  
  bVar1 = (byte)fs;
  bVar10 = (byte)ft;
  bVar2 = (byte)(fs >> 8);
  bVar11 = (byte)(ft >> 8);
  bVar3 = (byte)(fs >> 0x10);
  bVar12 = (byte)(ft >> 0x10);
  bVar4 = (byte)(fs >> 0x18);
  bVar13 = (byte)(ft >> 0x18);
  bVar5 = (byte)(fs >> 0x20);
  bVar14 = (byte)(ft >> 0x20);
  bVar6 = (byte)(fs >> 0x28);
  bVar15 = (byte)(ft >> 0x28);
  bVar7 = (byte)(fs >> 0x30);
  bVar16 = (byte)(ft >> 0x30);
  bVar9 = (byte)(ft >> 0x38);
  bVar8 = (byte)(fs >> 0x38);
  return CONCAT17(-((byte)((bVar8 < bVar9) * bVar8 | (bVar8 >= bVar9) * bVar9) == bVar8),
                  CONCAT16(-((byte)((bVar7 < bVar16) * bVar7 | (bVar7 >= bVar16) * bVar16) == bVar7)
                           ,CONCAT15(-((byte)((bVar6 < bVar15) * bVar6 | (bVar6 >= bVar15) * bVar15)
                                      == bVar6),
                                     CONCAT14(-((byte)((bVar5 < bVar14) * bVar5 |
                                                      (bVar5 >= bVar14) * bVar14) == bVar5),
                                              CONCAT13(-((byte)((bVar4 < bVar13) * bVar4 |
                                                               (bVar4 >= bVar13) * bVar13) == bVar4)
                                                       ,CONCAT12(-((byte)((bVar3 < bVar12) * bVar3 |
                                                                         (bVar3 >= bVar12) * bVar12)
                                                                  == bVar3),
                                                                 CONCAT11(-((byte)((bVar2 < bVar11)
                                                                                   * bVar2 |
                                                                                  (bVar2 >= bVar11)
                                                                                  * bVar11) == bVar2
                                                                           ),-((byte)((bVar1 < 
                                                  bVar10) * bVar1 | (bVar1 >= bVar10) * bVar10) ==
                                                  bVar1)))))))) ^ 0xffffffffffffffff;
}

Assistant:

uint64_t helper_pcmpgtb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; i++) {
        vs.ub[i] = -(vs.ub[i] > vt.ub[i]);
    }
    return vs.d;
}